

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O0

QStringList * __thiscall
QFileSystemComboBoxCompleter::splitPath(QFileSystemComboBoxCompleter *this,QString *path)

{
  QStringList *in_RDI;
  QFileSystemModel *model;
  undefined8 local_60;
  QString local_58;
  QDir local_40 [8];
  QString local_38;
  QFileSystemModel *local_20;
  
  ::QCompleter::model();
  local_20 = qobject_cast<QFileSystemModel*>((QObject *)0x2237cd);
  if (local_20 != (QFileSystemModel *)0x0) {
    QFileSystemModel::rootPath();
    QDir::QDir(local_40,&local_58);
    QDir::filePath(&local_38);
    ::QCompleter::splitPath((QString *)in_RDI);
    QString::~QString((QString *)0x223837);
    QDir::~QDir(local_40);
    QString::~QString((QString *)0x22384b);
    return in_RDI;
  }
  qt_assert_x("Q_UNREACHABLE()","Q_UNREACHABLE was reached",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp"
              ,0x16);
  _Unwind_Resume(local_60);
}

Assistant:

QStringList splitPath(const QString &path) const override {
        if (const auto model = qobject_cast<QFileSystemModel *>(QCompleter::model())) {
            return QCompleter::splitPath(QDir(model->rootPath()).filePath(path));
        }

        Q_UNREACHABLE();
    }